

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCMakeProjects
          (cmCPackGenerator *this,bool setDestDir,string *baseTempInstallDirectory,
          mode_t *default_dir_mode)

{
  pointer pcVar1;
  cmCPackLog *pcVar2;
  pointer pbVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  char *__s;
  size_t sVar8;
  long *plVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cmake *this_00;
  cmGlobalGenerator *pcVar10;
  ostream *poVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  string *installType;
  pointer pbVar15;
  undefined8 uVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  string buildConfig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  componentsVector;
  cmCPackInstallCMakeProject project;
  string installProjectName;
  string installDirectory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeProjectsVector;
  string local_208;
  string absoluteDestFiles;
  ostringstream cmCPackLog_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  _cmCPackLog_msg = (pointer)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmCPackLog_msg,"CPACK_INSTALL_CMAKE_PROJECTS","");
  pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_cmCPackLog_msg != local_198) {
    operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
  }
  _cmCPackLog_msg = (pointer)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmCPackLog_msg,"CPACK_CMAKE_GENERATOR","");
  __s = GetOption(this,(string *)&cmCPackLog_msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_cmCPackLog_msg != local_198) {
    operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
  }
  absoluteDestFiles._M_dataplus._M_p = (pointer)&absoluteDestFiles.field_2;
  absoluteDestFiles._M_string_length = 0;
  absoluteDestFiles.field_2._M_local_buf[0] = '\0';
  if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
    if (__s == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&cmCPackLog_msg,
                 "CPACK_INSTALL_CMAKE_PROJECTS is specified, but CPACK_CMAKE_GENERATOR is not. CPACK_CMAKE_GENERATOR is required to install the project."
                 ,0x86);
      std::ios::widen((char)&cmCPackLog_msg + (char)*(undefined8 *)(_cmCPackLog_msg + -0x18));
      std::ostream::put((char)&cmCPackLog_msg);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var4 = project.Directory._M_dataplus;
      sVar8 = strlen(project.Directory._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x205,_Var4._M_p,sVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)project.Directory._M_dataplus._M_p != &project.Directory.field_2) {
        operator_delete(project.Directory._M_dataplus._M_p,
                        CONCAT71(project.Directory.field_2._M_allocated_capacity._1_7_,
                                 project.Directory.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::ios_base::~ios_base(local_138);
LAB_0014e347:
      iVar6 = 0;
      goto LAB_0014e349;
    }
    cmakeProjectsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmakeProjectsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmakeProjectsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _cmCPackLog_msg = (pointer)local_198;
    sVar8 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&cmCPackLog_msg,pcVar7,pcVar7 + sVar8)
    ;
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&cmakeProjectsVector,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_cmCPackLog_msg != local_198) {
      operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
    }
    if (cmakeProjectsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        cmakeProjectsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = cmakeProjectsVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (((pbVar14 + 1 ==
              cmakeProjectsVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) ||
            (pbVar14 + 2 ==
             cmakeProjectsVector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) ||
           (pbVar14 + 3 ==
            cmakeProjectsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&cmCPackLog_msg,
                     "Not enough items on list: CPACK_INSTALL_CMAKE_PROJECTS. CPACK_INSTALL_CMAKE_PROJECTS should hold quadruplet of install directory, install project name, install component, and install subdirectory."
                     ,0xc4);
          std::ios::widen((char)&cmCPackLog_msg + (char)*(undefined8 *)(_cmCPackLog_msg + -0x18));
          std::ostream::put((char)&cmCPackLog_msg);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var4 = project.Directory._M_dataplus;
          sVar8 = strlen(project.Directory._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x216,_Var4._M_p,sVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)project.Directory._M_dataplus._M_p != &project.Directory.field_2) {
            operator_delete(project.Directory._M_dataplus._M_p,
                            CONCAT71(project.Directory.field_2._M_allocated_capacity._1_7_,
                                     project.Directory.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          std::ios_base::~ios_base(local_138);
LAB_0014e33a:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&cmakeProjectsVector);
          goto LAB_0014e347;
        }
        installDirectory._M_dataplus._M_p = (pointer)&installDirectory.field_2;
        pcVar1 = (pbVar14->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&installDirectory,pcVar1,pcVar1 + pbVar14->_M_string_length);
        installProjectName._M_dataplus._M_p = (pointer)&installProjectName.field_2;
        pcVar1 = pbVar14[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&installProjectName,pcVar1,pcVar1 + pbVar14[1]._M_string_length);
        project.Directory._M_dataplus._M_p = (pointer)&project.Directory.field_2;
        project.Directory._M_string_length = 0;
        project.Directory.field_2._M_local_buf[0] = '\0';
        project.ProjectName._M_dataplus._M_p = (pointer)&project.ProjectName.field_2;
        project.ProjectName._M_string_length = 0;
        project.ProjectName.field_2._M_local_buf[0] = '\0';
        project.Component._M_dataplus._M_p = (pointer)&project.Component.field_2;
        project.Component._M_string_length = 0;
        project.Component.field_2._M_local_buf[0] = '\0';
        project.SubDirectory._M_dataplus._M_p = (pointer)&project.SubDirectory.field_2;
        project.SubDirectory._M_string_length = 0;
        project.SubDirectory.field_2._M_local_buf[0] = '\0';
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::_M_assign((string *)&project);
        std::__cxx11::string::_M_assign((string *)&project.ProjectName);
        std::__cxx11::string::_M_assign((string *)&project.Component);
        std::__cxx11::string::_M_assign((string *)&project.SubDirectory);
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar6 = (*this->_vptr_cmCPackGenerator[0x18])(this);
        if ((char)iVar6 == '\0') {
          bVar5 = false;
        }
        else {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_208,"CPACK_MONOLITHIC_INSTALL","");
          pcVar7 = GetOption(this,&local_208);
          bVar5 = cmSystemTools::IsOn(pcVar7);
          bVar5 = !bVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar5) {
          cmsys::SystemTools::UpperCase((string *)&installTypesVector,&project.Component);
          plVar9 = (long *)std::__cxx11::string::replace
                                     ((ulong)&installTypesVector,0,(char *)0x0,0x53d619);
          buildConfig._M_dataplus._M_p = (pointer)&buildConfig.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar12) {
            buildConfig.field_2._M_allocated_capacity = *psVar12;
            buildConfig.field_2._8_8_ = plVar9[3];
          }
          else {
            buildConfig.field_2._M_allocated_capacity = *psVar12;
            buildConfig._M_dataplus._M_p = (pointer)*plVar9;
          }
          buildConfig._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&buildConfig);
          _cmCPackLog_msg = (pointer)local_198;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar13) {
            local_198[0]._0_8_ = paVar13->_M_allocated_capacity;
            local_198[0]._8_8_ = plVar9[3];
          }
          else {
            local_198[0]._0_8_ = paVar13->_M_allocated_capacity;
            _cmCPackLog_msg = (pointer)*plVar9;
          }
          *plVar9 = (long)paVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)buildConfig._M_dataplus._M_p != &buildConfig.field_2) {
            operator_delete(buildConfig._M_dataplus._M_p,
                            buildConfig.field_2._M_allocated_capacity + 1);
          }
          if (installTypesVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&installTypesVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(installTypesVector.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((installTypesVector.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
          if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
            installTypesVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            installTypesVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            installTypesVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            buildConfig._M_dataplus._M_p = (pointer)&buildConfig.field_2;
            sVar8 = strlen(pcVar7);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&buildConfig,pcVar7,pcVar7 + sVar8);
            cmSystemTools::ExpandListArgument(&buildConfig,&installTypesVector,false);
            pbVar15 = installTypesVector.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar3 = installTypesVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)buildConfig._M_dataplus._M_p != &buildConfig.field_2) {
              operator_delete(buildConfig._M_dataplus._M_p,
                              buildConfig.field_2._M_allocated_capacity + 1);
              pbVar15 = installTypesVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar3 = installTypesVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            }
            for (; pbVar15 != pbVar3; pbVar15 = pbVar15 + 1) {
              iVar6 = (*this->_vptr_cmCPackGenerator[0x1a])(this,&project.ProjectName,pbVar15);
              buildConfig._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar6);
              std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
              emplace_back<cmCPackInstallationType*>
                        ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>
                          *)&project.InstallationTypes,(cmCPackInstallationType **)&buildConfig);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&installTypesVector);
          }
          cmsys::SystemTools::UpperCase((string *)&installTypesVector,&project.Component);
          plVar9 = (long *)std::__cxx11::string::replace
                                     ((ulong)&installTypesVector,0,(char *)0x0,0x53d62f);
          buildConfig._M_dataplus._M_p = (pointer)&buildConfig.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar12) {
            buildConfig.field_2._M_allocated_capacity = *psVar12;
            buildConfig.field_2._8_8_ = plVar9[3];
          }
          else {
            buildConfig.field_2._M_allocated_capacity = *psVar12;
            buildConfig._M_dataplus._M_p = (pointer)*plVar9;
          }
          buildConfig._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (installTypesVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&installTypesVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(installTypesVector.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((installTypesVector.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          pcVar7 = GetOption(this,&buildConfig);
          if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
            uVar16 = 0;
          }
          else {
            installTypesVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&installTypesVector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            sVar8 = strlen(pcVar7);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&installTypesVector,pcVar7,pcVar7 + sVar8);
            cmSystemTools::ExpandListArgument((string *)&installTypesVector,&componentsVector,false)
            ;
            if (installTypesVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&installTypesVector.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(installTypesVector.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&((installTypesVector.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             _M_dataplus)._M_p + 1));
            }
            pbVar3 = componentsVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar16 = 1;
            for (pbVar15 = componentsVector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar3;
                pbVar15 = pbVar15 + 1) {
              iVar6 = (*this->_vptr_cmCPackGenerator[0x1b])(this,&project.ProjectName,pbVar15);
              installTypesVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar6);
              std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
              emplace_back<cmCPackComponent*>
                        ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                         &project.Components,(cmCPackComponent **)&installTypesVector);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)buildConfig._M_dataplus._M_p != &buildConfig.field_2) {
            operator_delete(buildConfig._M_dataplus._M_p,
                            buildConfig.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_cmCPackLog_msg != local_198) {
            operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
          }
        }
        else {
          uVar16 = 0;
        }
        if (componentsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            componentsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&componentsVector,&project.Component);
        }
        _cmCPackLog_msg = (pointer)local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&cmCPackLog_msg,"CPACK_BUILD_CONFIG","");
        pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_cmCPackLog_msg != local_198) {
          operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
        }
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "";
        }
        buildConfig._M_dataplus._M_p = (pointer)&buildConfig.field_2;
        sVar8 = strlen(pcVar7);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&buildConfig,pcVar7,pcVar7 + sVar8);
        this_00 = cmMakefile::GetCMakeInstance(this->MakefileMap);
        _cmCPackLog_msg = (pointer)local_198;
        sVar8 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&cmCPackLog_msg,__s,__s + sVar8);
        pcVar10 = cmake::CreateGlobalGenerator(this_00,(string *)&cmCPackLog_msg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_cmCPackLog_msg != local_198) {
          operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
        }
        if (pcVar10 == (cmGlobalGenerator *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&cmCPackLog_msg,
                     "Specified package generator not found. CPACK_CMAKE_GENERATOR value is invalid."
                     ,0x4e);
          std::ios::widen((char)&cmCPackLog_msg + (char)*(undefined8 *)(_cmCPackLog_msg + -0x18));
          std::ostream::put((char)&cmCPackLog_msg);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          pbVar14 = installTypesVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          sVar8 = strlen((char *)installTypesVector.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,599,(char *)pbVar14,sVar8);
          if (installTypesVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&installTypesVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(installTypesVector.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((installTypesVector.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          std::ios_base::~ios_base(local_138);
LAB_0014e205:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)buildConfig._M_dataplus._M_p != &buildConfig.field_2) {
            operator_delete(buildConfig._M_dataplus._M_p,
                            buildConfig.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&componentsVector);
          if (project.Components.
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(project.Components.
                            super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)project.Components.
                                  super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)project.Components.
                                  super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (project.InstallationTypes.
              super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(project.InstallationTypes.
                            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)project.InstallationTypes.
                                  super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)project.InstallationTypes.
                                  super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)project.SubDirectory._M_dataplus._M_p != &project.SubDirectory.field_2) {
            operator_delete(project.SubDirectory._M_dataplus._M_p,
                            CONCAT71(project.SubDirectory.field_2._M_allocated_capacity._1_7_,
                                     project.SubDirectory.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)project.Component._M_dataplus._M_p != &project.Component.field_2) {
            operator_delete(project.Component._M_dataplus._M_p,
                            CONCAT71(project.Component.field_2._M_allocated_capacity._1_7_,
                                     project.Component.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)project.ProjectName._M_dataplus._M_p != &project.ProjectName.field_2) {
            operator_delete(project.ProjectName._M_dataplus._M_p,
                            CONCAT71(project.ProjectName.field_2._M_allocated_capacity._1_7_,
                                     project.ProjectName.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)project.Directory._M_dataplus._M_p != &project.Directory.field_2) {
            operator_delete(project.Directory._M_dataplus._M_p,
                            CONCAT71(project.Directory.field_2._M_allocated_capacity._1_7_,
                                     project.Directory.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)installProjectName._M_dataplus._M_p != &installProjectName.field_2) {
            operator_delete(installProjectName._M_dataplus._M_p,
                            installProjectName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)installDirectory._M_dataplus._M_p != &installDirectory.field_2) {
            operator_delete(installDirectory._M_dataplus._M_p,
                            installDirectory.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0014e33a;
        }
        cmSystemTools::s_ForceUnixPaths = pcVar10->ForceUnixPaths;
        iVar6 = (*this->_vptr_cmCPackGenerator[0x14])
                          (this,&project.ProjectName,&project,pcVar10,&buildConfig);
        if (iVar6 == 0) goto LAB_0014e205;
        (*pcVar10->_vptr_cmGlobalGenerator[1])(pcVar10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&cmCPackLog_msg,"- Install project: ",0x13);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&cmCPackLog_msg,project.ProjectName._M_dataplus._M_p,
                             project.ProjectName._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        pbVar3 = installTypesVector.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar8 = strlen((char *)installTypesVector.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        cmCPackLog::Log(pcVar2,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x267,(char *)pbVar3,sVar8);
        if (installTypesVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&installTypesVector.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(installTypesVector.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((installTypesVector.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::ios_base::~ios_base(local_138);
        pbVar3 = componentsVector.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar15 = componentsVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar3;
            pbVar15 = pbVar15 + 1) {
          iVar6 = (*this->_vptr_cmCPackGenerator[0x15])
                            (this,(ulong)setDestDir,&project,baseTempInstallDirectory,
                             default_dir_mode,pbVar15,uVar16,&project.SubDirectory,&buildConfig,
                             &absoluteDestFiles);
          if (iVar6 == 0) goto LAB_0014e205;
        }
        std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>::
        push_back(&this->CMakeProjects,&project);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buildConfig._M_dataplus._M_p != &buildConfig.field_2) {
          operator_delete(buildConfig._M_dataplus._M_p,buildConfig.field_2._M_allocated_capacity + 1
                         );
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&componentsVector);
        if (project.Components.
            super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(project.Components.
                          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)project.Components.
                                super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)project.Components.
                                super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (project.InstallationTypes.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(project.InstallationTypes.
                          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)project.InstallationTypes.
                                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)project.InstallationTypes.
                                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)project.SubDirectory._M_dataplus._M_p != &project.SubDirectory.field_2) {
          operator_delete(project.SubDirectory._M_dataplus._M_p,
                          CONCAT71(project.SubDirectory.field_2._M_allocated_capacity._1_7_,
                                   project.SubDirectory.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)project.Component._M_dataplus._M_p != &project.Component.field_2) {
          operator_delete(project.Component._M_dataplus._M_p,
                          CONCAT71(project.Component.field_2._M_allocated_capacity._1_7_,
                                   project.Component.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)project.ProjectName._M_dataplus._M_p != &project.ProjectName.field_2) {
          operator_delete(project.ProjectName._M_dataplus._M_p,
                          CONCAT71(project.ProjectName.field_2._M_allocated_capacity._1_7_,
                                   project.ProjectName.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)project.Directory._M_dataplus._M_p != &project.Directory.field_2) {
          operator_delete(project.Directory._M_dataplus._M_p,
                          CONCAT71(project.Directory.field_2._M_allocated_capacity._1_7_,
                                   project.Directory.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)installProjectName._M_dataplus._M_p != &installProjectName.field_2) {
          operator_delete(installProjectName._M_dataplus._M_p,
                          installProjectName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)installDirectory._M_dataplus._M_p != &installDirectory.field_2) {
          operator_delete(installDirectory._M_dataplus._M_p,
                          installDirectory.field_2._M_allocated_capacity + 1);
        }
        pbVar14 = pbVar14 + 4;
      } while (pbVar14 !=
               cmakeProjectsVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmakeProjectsVector);
  }
  _cmCPackLog_msg = (pointer)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmCPackLog_msg,"CPACK_ABSOLUTE_DESTINATION_FILES","");
  SetOption(this,(string *)&cmCPackLog_msg,absoluteDestFiles._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_cmCPackLog_msg != local_198) {
    operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
  }
  iVar6 = 1;
LAB_0014e349:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)absoluteDestFiles._M_dataplus._M_p != &absoluteDestFiles.field_2) {
    operator_delete(absoluteDestFiles._M_dataplus._M_p,
                    CONCAT71(absoluteDestFiles.field_2._M_allocated_capacity._1_7_,
                             absoluteDestFiles.field_2._M_local_buf[0]) + 1);
  }
  return iVar6;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCMakeProjects(
  bool setDestDir, const std::string& baseTempInstallDirectory,
  const mode_t* default_dir_mode)
{
  const char* cmakeProjects = this->GetOption("CPACK_INSTALL_CMAKE_PROJECTS");
  const char* cmakeGenerator = this->GetOption("CPACK_CMAKE_GENERATOR");
  std::string absoluteDestFiles;
  if (cmakeProjects && *cmakeProjects) {
    if (!cmakeGenerator) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "CPACK_INSTALL_CMAKE_PROJECTS is specified, but "
                    "CPACK_CMAKE_GENERATOR is not. CPACK_CMAKE_GENERATOR "
                    "is required to install the project."
                      << std::endl);
      return 0;
    }
    std::vector<std::string> cmakeProjectsVector;
    cmSystemTools::ExpandListArgument(cmakeProjects, cmakeProjectsVector);
    std::vector<std::string>::iterator it;
    for (it = cmakeProjectsVector.begin(); it != cmakeProjectsVector.end();
         ++it) {
      if (it + 1 == cmakeProjectsVector.end() ||
          it + 2 == cmakeProjectsVector.end() ||
          it + 3 == cmakeProjectsVector.end()) {
        cmCPackLogger(
          cmCPackLog::LOG_ERROR,
          "Not enough items on list: CPACK_INSTALL_CMAKE_PROJECTS. "
          "CPACK_INSTALL_CMAKE_PROJECTS should hold quadruplet of install "
          "directory, install project name, install component, and install "
          "subdirectory."
            << std::endl);
        return 0;
      }
      std::string installDirectory = *it;
      ++it;
      std::string installProjectName = *it;
      ++it;
      cmCPackInstallCMakeProject project;

      project.Directory = installDirectory;
      project.ProjectName = installProjectName;
      project.Component = *it;
      ++it;
      project.SubDirectory = *it;

      std::vector<std::string> componentsVector;

      bool componentInstall = false;
      /*
       * We do a component install iff
       *    - the CPack generator support component
       *    - the user did not request Monolithic install
       *      (this works at CPack time too)
       */
      if (this->SupportsComponentInstallation() &&
          !(this->IsOn("CPACK_MONOLITHIC_INSTALL"))) {
        // Determine the installation types for this project (if provided).
        std::string installTypesVar = "CPACK_" +
          cmSystemTools::UpperCase(project.Component) + "_INSTALL_TYPES";
        const char* installTypes = this->GetOption(installTypesVar);
        if (installTypes && *installTypes) {
          std::vector<std::string> installTypesVector;
          cmSystemTools::ExpandListArgument(installTypes, installTypesVector);
          for (std::string const& installType : installTypesVector) {
            project.InstallationTypes.push_back(
              this->GetInstallationType(project.ProjectName, installType));
          }
        }

        // Determine the set of components that will be used in this project
        std::string componentsVar =
          "CPACK_COMPONENTS_" + cmSystemTools::UpperCase(project.Component);
        const char* components = this->GetOption(componentsVar);
        if (components && *components) {
          cmSystemTools::ExpandListArgument(components, componentsVector);
          for (std::string const& comp : componentsVector) {
            project.Components.push_back(
              this->GetComponent(project.ProjectName, comp));
          }
          componentInstall = true;
        }
      }
      if (componentsVector.empty()) {
        componentsVector.push_back(project.Component);
      }

      const char* buildConfigCstr = this->GetOption("CPACK_BUILD_CONFIG");
      std::string buildConfig = buildConfigCstr ? buildConfigCstr : "";
      cmGlobalGenerator* globalGenerator =
        this->MakefileMap->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGenerator);
      if (!globalGenerator) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Specified package generator not found. "
                      "CPACK_CMAKE_GENERATOR value is invalid."
                        << std::endl);
        return 0;
      }
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(globalGenerator->GetForceUnixPaths());

      if (!this->RunPreinstallTarget(project.ProjectName, project.Directory,
                                     globalGenerator, buildConfig)) {
        return 0;
      }

      delete globalGenerator;

      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- Install project: " << project.ProjectName << std::endl);

      // Run the installation for each component
      for (std::string const& component : componentsVector) {
        if (!this->InstallCMakeProject(
              setDestDir, project.Directory, baseTempInstallDirectory,
              default_dir_mode, component, componentInstall,
              project.SubDirectory, buildConfig, absoluteDestFiles)) {
          return 0;
        }
      }

      this->CMakeProjects.push_back(project);
    }
  }
  this->SetOption("CPACK_ABSOLUTE_DESTINATION_FILES",
                  absoluteDestFiles.c_str());
  return 1;
}